

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O2

RGBResult * __thiscall
AsyncRgbLedAnalyzer::ReadRGBTriple(RGBResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  U64 UVar1;
  byte bVar2;
  ColorLayout layout;
  RGBValue RVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  U64 UVar7;
  RGBResult *pRVar8;
  U16 channels [3];
  DataBuilder builder;
  U64 value;
  ReadResult bitResult;
  U64 local_70;
  U16 local_68 [4];
  RGBResult *local_60;
  DataBuilder local_58 [8];
  undefined8 local_50;
  ReadResult local_48;
  
  bVar2 = AsyncRgbLedAnalyzerSettings::BitSize
                    ((this->mSettings)._M_t.
                     super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  local_68[2] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  __return_storage_ptr__->mValid = false;
  (__return_storage_ptr__->mRGB).red = 0;
  (__return_storage_ptr__->mRGB).green = 0;
  (__return_storage_ptr__->mRGB).blue = 0;
  (__return_storage_ptr__->mRGB).padding = 0;
  __return_storage_ptr__->mValueBeginSample = 0;
  __return_storage_ptr__->mValueEndSample = 0;
  local_60 = __return_storage_ptr__;
  DataBuilder::DataBuilder(local_58);
  lVar5 = 0;
  UVar7 = 0;
  bVar4 = false;
  local_70 = 0;
  do {
    if (lVar5 == 3) {
      local_60->mValueEndSample = UVar7;
      local_60->mValueBeginSample = local_70;
      local_60->mIsReset = bVar4;
LAB_001071b6:
      pRVar8 = local_60;
      layout = AsyncRgbLedAnalyzerSettings::GetColorLayout
                         ((this->mSettings)._M_t.
                          super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                          .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl)
      ;
      RVar3 = RGBValue::CreateFromControllerOrder(layout,local_68);
      pRVar8->mRGB = RVar3;
      pRVar8->mValid = true;
LAB_001071d3:
      DataBuilder::~DataBuilder(local_58);
      return pRVar8;
    }
    local_50 = 0;
    DataBuilder::Reset((ulonglong *)local_58,(ShiftOrder)&local_50,0);
    for (uVar6 = 0; bVar2 != uVar6; uVar6 = uVar6 + 1) {
      ReadBit(&local_48,this);
      UVar1 = local_48.mEndSample;
      if (local_48.mValid == false) {
        if (bVar2 != uVar6) {
          local_60->mValueEndSample = UVar7;
          local_60->mValueBeginSample = local_70;
          local_60->mIsReset = bVar4;
          pRVar8 = local_60;
          if (lVar5 != 3) goto LAB_001071d3;
          goto LAB_001071b6;
        }
        break;
      }
      if (uVar6 == 0 && (int)lVar5 == 0) {
        local_70 = local_48.mBeginSample;
      }
      DataBuilder::AddBit((BitState)local_58);
      UVar7 = UVar1;
      bVar4 = local_48.mIsReset;
    }
    local_68[lVar5] = (U16)local_50;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadRGBTriple() -> RGBResult
{
    const U8 bitSize = mSettings->BitSize();
    U16 channels[ 3 ] = { 0, 0, 0 };
    RGBResult result;

    DataBuilder builder;
    int channel = 0;

    for( ; channel < 3; )
    {
        U64 value = 0;
        builder.Reset( &value, AnalyzerEnums::MsbFirst, bitSize );
        int i = 0;

        for( ; i < bitSize; ++i )
        {
            auto bitResult = ReadBit();

            if( !bitResult.mValid )
            {
                break;
            }

            // for the first bit of channel 0, record the beginning time
            // for accurate frame positions in the results
            if( ( i == 0 ) && ( channel == 0 ) )
            {
                result.mValueBeginSample = bitResult.mBeginSample;
            }

            result.mValueEndSample = bitResult.mEndSample;
            builder.AddBit( bitResult.mBitValue );
            result.mIsReset = bitResult.mIsReset;
        }

        if( i == bitSize )
        {
            // we saw a complete channel, save it
            channels[ channel++ ] = value;
        }
        else
        {
            // partial data due to reset or invalid timing, discard
            break;
        }
    }

    if( channel == 3 )
    {
        // we saw three complete channels, we can use this
        result.mRGB = RGBValue::CreateFromControllerOrder( mSettings->GetColorLayout(), channels );
        result.mValid = true;
    } // in all other cases, mValid stays false - no RGB data was written

    return result;
}